

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Conditional * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Binary*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Local*>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,Binary **args_2,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_3,AST **args_4,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_5,Local **args_6)

{
  Conditional *branch_true;
  Fodder *in_RCX;
  AST *in_RDX;
  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *in_RDI;
  Conditional *in_R9;
  Conditional *r;
  value_type *in_stack_ffffffffffffff98;
  Fodder *in_stack_ffffffffffffffb0;
  AST *in_stack_ffffffffffffffb8;
  Fodder *in_stack_ffffffffffffffc0;
  LocationRange *in_stack_ffffffffffffffc8;
  
  branch_true = (Conditional *)operator_new(200);
  Conditional::Conditional
            (in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,(AST *)branch_true,in_RCX,in_RDX);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (in_RDI,in_stack_ffffffffffffff98);
  return branch_true;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }